

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_close_in_callback(void)

{
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  int in_ECX;
  int extraout_EDX;
  long lVar4;
  char *pcVar5;
  uv_handle_t *handle;
  uv_fs_event_t *puVar6;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_6e0 [16];
  uv__queue uStack_6d0;
  uv__queue *puStack_6c0;
  uv_timer_t uStack_6b8;
  uv_fs_event_t uStack_640;
  uv_loop_t *puStack_5d8;
  uv_fs_event_t *puStack_5d0;
  long lStack_5c8;
  long lStack_5c0;
  uv_loop_t *puStack_5b8;
  long lStack_5b0;
  long lStack_5a8;
  uv_loop_t *puStack_5a0;
  size_t sStack_590;
  size_t sStack_588;
  size_t sStack_580;
  char acStack_578 [1032];
  uv_loop_t *puStack_170;
  undefined1 auStack_120 [16];
  uv_fs_event_t uStack_110;
  uv_fs_event_t uStack_a8;
  uv_loop_t *puStack_40;
  void *local_10;
  
  puVar3 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  local_10 = (void *)(long)iVar2;
  if (local_10 == (void *)0x0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir",0);
    local_10 = (void *)(long)iVar2;
    if (local_10 != (void *)0x0) goto LAB_00185cef;
    iVar2 = uv_timer_init(puVar3,&timer);
    local_10 = (void *)(long)iVar2;
    if (local_10 != (void *)0x0) goto LAB_00185cfc;
    in_ECX = 0;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100,0);
    local_10 = (void *)(long)iVar2;
    if (local_10 != (void *)0x0) goto LAB_00185d09;
    uv_run(puVar3,UV_RUN_DEFAULT);
    uv_close((uv_handle_t *)&timer,close_cb);
    uv_run(puVar3,UV_RUN_ONCE);
    local_10 = (void *)0x2;
    if (close_cb_called != 2) goto LAB_00185d16;
    local_10 = (void *)0x3;
    if (fs_event_cb_called != 3) goto LAB_00185d23;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/");
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_10 = (void *)0x0;
    iVar2 = uv_loop_close(puVar3);
    if (local_10 == (void *)(long)iVar2) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_close_in_callback_cold_1();
LAB_00185cef:
    run_test_fs_event_close_in_callback_cold_2();
LAB_00185cfc:
    run_test_fs_event_close_in_callback_cold_3();
LAB_00185d09:
    run_test_fs_event_close_in_callback_cold_4();
LAB_00185d16:
    run_test_fs_event_close_in_callback_cold_5();
LAB_00185d23:
    run_test_fs_event_close_in_callback_cold_6();
  }
  handle = (uv_handle_t *)&stack0xfffffffffffffff0;
  run_test_fs_event_close_in_callback_cold_7();
  if (in_ECX == 0) {
    in_ECX = fs_event_cb_called;
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close(handle,close_cb);
        return extraout_EAX;
      }
      return fs_event_cb_called;
    }
  }
  else {
    fs_event_cb_close_cold_1();
  }
  fs_event_cb_close_cold_2();
  puStack_40 = puVar3;
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar3,&uStack_a8);
  uStack_110.data = (void *)(long)iVar2;
  auStack_120._0_8_ = (uv_loop_t *)0x0;
  if (uStack_110.data == (void *)0x0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_a8,fs_event_cb_dir,"watch_dir",0);
    uStack_110.data = (void *)(long)iVar2;
    auStack_120._0_8_ = (uv_loop_t *)0x0;
    if (uStack_110.data != (void *)0x0) goto LAB_00185f70;
    iVar2 = uv_fs_event_init(puVar3,&uStack_110);
    auStack_120._0_8_ = SEXT48(iVar2);
    auStack_120._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_120._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f7f;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_110,fs_event_cb_dir,"watch_dir",0);
    auStack_120._0_8_ = SEXT48(iVar2);
    auStack_120._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_120._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f8e;
    uv_close((uv_handle_t *)&uStack_110,close_cb);
    uv_close((uv_handle_t *)&uStack_a8,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_120._0_8_ = (uv_loop_t *)0x2;
    auStack_120._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_120._8_8_ != (uv_loop_t *)0x2) goto LAB_00185f9d;
    remove("watch_dir/");
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_120._0_8_ = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(puVar3);
    auStack_120._8_8_ = SEXT48(iVar2);
    if (auStack_120._0_8_ == auStack_120._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00185f70:
    run_test_fs_event_start_and_close_cold_2();
LAB_00185f7f:
    run_test_fs_event_start_and_close_cold_3();
LAB_00185f8e:
    run_test_fs_event_start_and_close_cold_4();
LAB_00185f9d:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar6 = (uv_fs_event_t *)auStack_120;
  pcVar5 = auStack_120 + 8;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    if (in_ECX != 0) goto LAB_00186089;
    if (extraout_EDX != 2) goto LAB_00186098;
    iVar2 = strcmp(pcVar5,"file1");
    if (iVar2 != 0) goto LAB_001860a7;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX_00;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00186089:
    fs_event_cb_dir_cold_2();
LAB_00186098:
    fs_event_cb_dir_cold_3();
LAB_001860a7:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_5a0 = (uv_loop_t *)0x1860db;
  puStack_170 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5a0 = (uv_loop_t *)0x1860ea;
  create_dir("watch_dir");
  puStack_5a0 = (uv_loop_t *)0x1860f6;
  create_dir("watch_dir/subfolder");
  lVar4 = 0;
  sVar1 = sStack_590;
  do {
    sStack_590 = sVar1;
    puStack_5a0 = (uv_loop_t *)0x186114;
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0;
    if (sStack_588 != 0) {
LAB_00186404:
      puStack_5a0 = (uv_loop_t *)0x186413;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00186413;
    }
    sStack_580 = 0x400;
    puStack_5a0 = (uv_loop_t *)0x18614b;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0xffffffffffffffea;
    if (sStack_588 != 0xffffffffffffffea) {
LAB_001863f5:
      puStack_5a0 = (uv_loop_t *)0x186404;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00186404;
    }
    pcVar5 = *(char **)((long)&DAT_00268bc0 + lVar4);
    puStack_5a0 = (uv_loop_t *)0x18618b;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar5,0);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0;
    if (sStack_588 != 0) {
LAB_001863e6:
      puStack_5a0 = (uv_loop_t *)0x1863f5;
      run_test_fs_event_getpath_cold_3();
      goto LAB_001863f5;
    }
    sStack_580 = 0;
    puStack_5a0 = (uv_loop_t *)0x1861c2;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0xffffffffffffff97;
    if (sStack_588 != 0xffffffffffffff97) {
LAB_001863d7:
      puStack_5a0 = (uv_loop_t *)0x1863e6;
      run_test_fs_event_getpath_cold_4();
      goto LAB_001863e6;
    }
    sStack_588 = sStack_580;
    sStack_590 = 0x400;
    if (0x3ff < (long)sStack_580) {
LAB_001863c8:
      puStack_5a0 = (uv_loop_t *)0x1863d7;
      run_test_fs_event_getpath_cold_5();
      goto LAB_001863d7;
    }
    puStack_5a0 = (uv_loop_t *)0x186212;
    sStack_590 = strlen(pcVar5);
    sStack_590 = sStack_590 + 1;
    if (sStack_588 != sStack_590) {
LAB_001863b9:
      puStack_5a0 = (uv_loop_t *)0x1863c8;
      run_test_fs_event_getpath_cold_6();
      goto LAB_001863c8;
    }
    puStack_5a0 = (uv_loop_t *)0x186238;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_578,&sStack_580);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0;
    if (sStack_588 != 0) {
LAB_001863aa:
      puStack_5a0 = (uv_loop_t *)0x1863b9;
      run_test_fs_event_getpath_cold_7();
      goto LAB_001863b9;
    }
    sStack_588 = sStack_580;
    puStack_5a0 = (uv_loop_t *)0x18626a;
    sStack_590 = strlen(pcVar5);
    if (sStack_588 != sStack_590) {
LAB_0018639b:
      puStack_5a0 = (uv_loop_t *)0x1863aa;
      run_test_fs_event_getpath_cold_8();
      goto LAB_001863aa;
    }
    puStack_5a0 = (uv_loop_t *)0x18628a;
    iVar2 = strcmp(acStack_578,pcVar5);
    if (iVar2 != 0) {
LAB_00186396:
      puStack_5a0 = (uv_loop_t *)0x18639b;
      run_test_fs_event_getpath_cold_9();
      goto LAB_0018639b;
    }
    puStack_5a0 = (uv_loop_t *)0x18629a;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_588 = (size_t)iVar2;
    sStack_590 = 0;
    if (sStack_588 != 0) {
LAB_00186387:
      puStack_5a0 = (uv_loop_t *)0x186396;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00186396;
    }
    puStack_5a0 = (uv_loop_t *)0x1862c9;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_5a0 = (uv_loop_t *)0x1862d3;
    uv_run(puVar3,UV_RUN_DEFAULT);
    sStack_588 = 1;
    sStack_590 = (size_t)close_cb_called;
    if (sStack_590 != 1) {
      puStack_5a0 = (uv_loop_t *)0x186387;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00186387;
    }
    close_cb_called = 0;
    lVar4 = lVar4 + 8;
    sVar1 = 1;
  } while (lVar4 != 0x28);
  puStack_5a0 = (uv_loop_t *)0x18631c;
  remove("watch_dir/");
  puStack_5a0 = (uv_loop_t *)0x18632d;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_5a0 = (uv_loop_t *)0x186337;
  uv_run(puVar3,UV_RUN_DEFAULT);
  sStack_588 = 0;
  puStack_5a0 = (uv_loop_t *)0x186348;
  iVar2 = uv_loop_close(puVar3);
  sStack_590 = (size_t)iVar2;
  if (sStack_588 == sStack_590) {
    puStack_5a0 = (uv_loop_t *)0x186364;
    uv_library_shutdown();
    return 0;
  }
LAB_00186413:
  puStack_5a0 = (uv_loop_t *)run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  puStack_5b8 = (uv_loop_t *)0x18642c;
  puStack_5a0 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5b8 = (uv_loop_t *)0x186440;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_5b8 = (uv_loop_t *)0x18644a;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_5a8 = 0;
  puStack_5b8 = (uv_loop_t *)0x186458;
  loop = uv_default_loop();
  puStack_5b8 = (uv_loop_t *)0x186460;
  iVar2 = uv_loop_close(loop);
  lStack_5b0 = (long)iVar2;
  if (lStack_5a8 == lStack_5b0) {
    puStack_5b8 = (uv_loop_t *)0x186476;
    uv_library_shutdown();
    return 0;
  }
  puStack_5b8 = (uv_loop_t *)run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_5d0 = (uv_fs_event_t *)0x186495;
  puStack_5b8 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5d0 = (uv_fs_event_t *)0x1864a7;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  lStack_5c0 = (long)iVar2;
  lStack_5c8 = 0;
  if (lStack_5c0 == 0) {
    puStack_5d0 = (uv_fs_event_t *)0x1864e1;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_001865b4;
    puStack_5d0 = (uv_fs_event_t *)0x1864f5;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_5c0 = (long)iVar2;
    lStack_5c8 = 0;
    if (lStack_5c0 != 0) goto LAB_001865b9;
    puStack_5d0 = (uv_fs_event_t *)0x18652f;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_001865c6;
    puStack_5d0 = (uv_fs_event_t *)0x186543;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_5c0 = (long)iVar2;
    lStack_5c8 = 0;
    if (lStack_5c0 != 0) goto LAB_001865cb;
    puStack_5d0 = (uv_fs_event_t *)0x18656e;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_5d0 = (uv_fs_event_t *)0x186578;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_5c0 = 0;
    puStack_5d0 = (uv_fs_event_t *)0x186589;
    iVar2 = uv_loop_close(puVar3);
    lStack_5c8 = (long)iVar2;
    if (lStack_5c0 == lStack_5c8) {
      puStack_5d0 = (uv_fs_event_t *)0x18659f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5d0 = (uv_fs_event_t *)0x1865b4;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_001865b4:
    puStack_5d0 = (uv_fs_event_t *)0x1865b9;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_001865b9:
    puStack_5d0 = (uv_fs_event_t *)0x1865c6;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_001865c6:
    puStack_5d0 = (uv_fs_event_t *)0x1865cb;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_001865cb:
    puStack_5d0 = (uv_fs_event_t *)0x1865d8;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_5d0 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_5d0 = &fs_event;
  puVar6 = (uv_fs_event_t *)auStack_6e0;
  uStack_6d0.next = (uv__queue *)0x746e6576655f7366;
  uStack_6d0.prev = (uv__queue *)0x6e695f706f74735f;
  puStack_6c0 = (uv__queue *)0x7478742e62635f;
  puStack_5d8 = puVar3;
  remove((char *)&uStack_6d0);
  create_file((char *)&uStack_6d0);
  puVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(puVar3,&uStack_640);
  uStack_6b8.data = (void *)(long)iVar2;
  auStack_6e0._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)uStack_6b8.data == (uv__queue *)0x0) {
    iVar2 = uv_fs_event_start(&uStack_640,fs_event_cb_stop,(char *)&uStack_6d0,0);
    uStack_6b8.data = (void *)(long)iVar2;
    auStack_6e0._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_6b8.data != (uv__queue *)0x0) goto LAB_00186886;
    uStack_6b8.data = &uStack_6d0;
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&uStack_6b8);
    auStack_6e0._0_8_ = SEXT48(iVar2);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_00186893;
    iVar2 = uv_timer_start(&uStack_6b8,timer_cb_touch,100,0);
    auStack_6e0._0_8_ = SEXT48(iVar2);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a0;
    auStack_6e0._0_8_ = SEXT48(fs_event_cb_stop_calls);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ad;
    auStack_6e0._0_8_ = SEXT48(timer_cb_touch_called);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ba;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6e0._0_8_ = SEXT48(iVar2);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868c7;
    auStack_6e0._0_8_ = (uv_loop_t *)0x1;
    auStack_6e0._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6e0._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d4;
    auStack_6e0._0_8_ = (uv_loop_t *)0x1;
    auStack_6e0._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)auStack_6e0._8_8_ != (uv_loop_t *)0x1) goto LAB_001868e1;
    uv_close((uv_handle_t *)&uStack_640,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6e0._0_8_ = SEXT48(iVar2);
    auStack_6e0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6e0._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ee;
    auStack_6e0._0_8_ = (uv_loop_t *)0x1;
    auStack_6e0._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6e0._8_8_ == (uv_loop_t *)0x1) {
      remove((char *)&uStack_6d0);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_6e0._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_6e0._8_8_ = SEXT48(iVar2);
      if (auStack_6e0._0_8_ == auStack_6e0._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00186908;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_00186886:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_00186893:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_001868a0:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868ad:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868ba:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868c7:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868d4:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868e1:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868ee:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186908:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(puVar6);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(fs_event_close_in_callback) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#elif defined(__APPLE__) && defined(__TSAN__)
  RETURN_SKIP("Times out under TSAN.");
#endif
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  fs_event_unlink_files(NULL);
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_close, "watch_dir", 0);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*)&timer, close_cb);

  uv_run(loop, UV_RUN_ONCE);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(3, fs_event_cb_called);

  /* Clean up */
  fs_event_unlink_files(NULL);
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}